

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.cpp
# Opt level: O0

void __thiscall CSounds::Play(CSounds *this,int Chn,int SetId,float Vol)

{
  long lVar1;
  bool bVar2;
  CSampleHandle CVar3;
  CConfig *pCVar4;
  ISound *pIVar5;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int Flags;
  CSampleHandle SampleId;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(byte *)(*(long *)(in_RDI + 8) + 0xd24) & 1) == 0) &&
     ((in_ESI != 1 || (pCVar4 = CComponent::Config((CComponent *)0x1c28f3), pCVar4->m_SndMusic != 0)
      ))) {
    CVar3 = GetSampleId((CSounds *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                        (int)((ulong)in_RDI >> 0x20));
    bVar2 = ISound::CSampleHandle::IsValid((CSampleHandle *)0x1c291a);
    if (bVar2) {
      pIVar5 = CComponent::Sound((CComponent *)0x1c2941);
      (*(pIVar5->super_IInterface)._vptr_IInterface[8])
                (pIVar5,(ulong)in_ESI,(ulong)(uint)CVar3.m_Id,(ulong)(in_ESI == 1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CSounds::Play(int Chn, int SetId, float Vol)
{
	if(m_pClient->m_SuppressEvents)
		return;
	if(Chn == CHN_MUSIC && !Config()->m_SndMusic)
		return;

	ISound::CSampleHandle SampleId = GetSampleId(SetId);
	if(!SampleId.IsValid())
		return;

	int Flags = 0;
	if(Chn == CHN_MUSIC)
		Flags = ISound::FLAG_LOOP;

	Sound()->Play(Chn, SampleId, Flags);
}